

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

JSON JSON::makeBlob(function<void_(Pipeline_*)> *fn)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  JSON JVar2;
  undefined1 local_20 [16];
  
  std::make_unique<JSON::JSON_blob,std::function<void(Pipeline*)>&>
            ((function<void_(Pipeline_*)> *)local_20);
  local_20._8_8_ = local_20._0_8_;
  local_20._0_8_ = (long *)0x0;
  JSON((JSON *)fn,
       (unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> *)(local_20 + 8));
  _Var1._M_pi = extraout_RDX;
  if ((long *)local_20._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_20._8_8_ + 8))();
    _Var1._M_pi = extraout_RDX_00;
  }
  if ((long *)local_20._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_20._0_8_ + 8))();
    _Var1._M_pi = extraout_RDX_01;
  }
  JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)fn;
  return (JSON)JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::makeBlob(std::function<void(Pipeline*)> fn)
{
    return {std::make_unique<JSON_blob>(fn)};
}